

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_cond_move(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 ret;
  TCGOpcode TVar4;
  TCGCond cond;
  uintptr_t o_2;
  TCGv_i64 v1;
  uintptr_t o_3;
  TCGv_i64 c1;
  
  if (rd == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  c1 = (TCGv_i64)((long)pTVar1 - (long)s);
  if (rt == 0) {
    TVar4 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_009a0049:
    tcg_gen_op2_mips64el(s,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
  }
  else if (s->cpu_gpr[rt] != c1) {
    pTVar2 = s->cpu_gpr[rt] + (long)s;
    TVar4 = INDEX_op_mov_i64;
    goto LAB_009a0049;
  }
  pTVar2 = tcg_const_i64_mips64el(s,0);
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  v1 = (TCGv_i64)((long)pTVar1 - (long)s);
  if (rs == 0) {
    TVar4 = INDEX_op_movi_i64;
    pTVar3 = (TCGv_i64)0x0;
LAB_009a00a1:
    tcg_gen_op2_mips64el(s,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar3);
  }
  else if (s->cpu_gpr[rs] != v1) {
    pTVar3 = s->cpu_gpr[rs] + (long)s;
    TVar4 = INDEX_op_mov_i64;
    goto LAB_009a00a1;
  }
  if ((int)opc < 0x35) {
    if (opc != 10) {
      if (opc != 0xb) goto LAB_009a0128;
      ret = s->cpu_gpr[(uint)rd];
      pTVar3 = ret;
      goto LAB_009a00e6;
    }
    ret = s->cpu_gpr[(uint)rd];
    pTVar3 = ret;
LAB_009a0112:
    cond = TCG_COND_EQ;
  }
  else {
    pTVar3 = pTVar2;
    if (opc == 0x35) {
      ret = s->cpu_gpr[(uint)rd];
      goto LAB_009a0112;
    }
    if (opc != 0x37) goto LAB_009a0128;
    ret = s->cpu_gpr[(uint)rd];
LAB_009a00e6:
    cond = TCG_COND_NE;
  }
  tcg_gen_movcond_i64_mips64el(s,cond,ret,c1,pTVar2,v1,pTVar3);
LAB_009a0128:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(v1 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar2 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(c1 + (long)s));
  return;
}

Assistant:

static void gen_cond_move(DisasContext *ctx, uint32_t opc,
                          int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1, t2;

    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    t1 = tcg_const_tl(tcg_ctx, 0);
    t2 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t2, rs);
    switch (opc) {
    case OPC_MOVN:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MOVZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_SELNEZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    case OPC_SELEQZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    }
    tcg_temp_free(tcg_ctx, t2);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);
}